

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * uprv_decNumberFromUInt32_63(decNumber *dn,uint32_t uin)

{
  int32_t iVar1;
  uint8_t *local_28;
  uint8_t *up;
  uint32_t uin_local;
  decNumber *dn_local;
  
  uprv_decNumberZero_63(dn);
  if (uin != 0) {
    local_28 = dn->lsu;
    for (up._4_4_ = uin; up._4_4_ != 0; up._4_4_ = up._4_4_ / 10) {
      *local_28 = (uint8_t)((ulong)up._4_4_ % 10);
      local_28 = local_28 + 1;
    }
    iVar1 = decGetDigits(dn->lsu,(int)local_28 - ((int)dn + 9));
    dn->digits = iVar1;
  }
  return dn;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberFromUInt32(decNumber *dn, uInt uin) {
  Unit *up;                             /* work pointer  */
  uprv_decNumberZero(dn);                    /* clean  */
  if (uin==0) return dn;                /* [or decGetDigits bad call]  */
  for (up=dn->lsu; uin>0; up++) {
    *up=(Unit)(uin%(DECDPUNMAX+1));
    uin=uin/(DECDPUNMAX+1);
    }
  dn->digits=decGetDigits(dn->lsu, static_cast<int32_t>(up - dn->lsu));
  return dn;
  }